

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutation.cpp
# Opt level: O2

bool __thiscall Permutation::IsIdentity(Permutation *this)

{
  pointer piVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  piVar1 = (this->permutation_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(this->permutation_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1) >> 2;
  iVar3 = (int)uVar4;
  uVar5 = 0;
  uVar2 = 0;
  if (0 < iVar3) {
    uVar5 = uVar4 & 0xffffffff;
  }
  do {
    uVar4 = uVar2;
    if (uVar5 == uVar4) break;
    uVar2 = uVar4 + 1;
  } while (uVar4 == (uint)piVar1[uVar4]);
  return (long)iVar3 <= (long)uVar4;
}

Assistant:

bool Permutation::IsIdentity() const {
    for (int i = 0; i < static_cast<int>(permutation_.size()); ++i) {
        if (permutation_[i] != i) {
            return false;
        }
    }

    return true;
}